

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

sexp_conflict sexp_fixnum_to_twos_complement(sexp_conflict ctx,sexp_conflict x,int len)

{
  sexp_conflict psVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  sexp_gc_var_t local_40;
  sexp_conflict local_30;
  
  local_40.var = &local_30;
  local_30 = (sexp_conflict)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  lVar4 = (long)len;
  local_30 = (sexp_conflict)sexp_make_bignum(ctx,lVar4);
  lVar3 = (long)x >> 1;
  if (lVar3 < 0) {
    for (uVar2 = (ulong)(uint)len; 1 < (int)uVar2; uVar2 = uVar2 - 1) {
      *(undefined8 *)((long)&local_30->value + uVar2 * 8 + 8) = 0xffffffffffffffff;
    }
  }
  (local_30->value).type.slots = (sexp)(lVar3 + -1);
  psVar1 = (sexp_conflict)sexp_bignum_fxadd(ctx,local_30,1);
  if (((psVar1->value).type.cpl == (sexp)(long)(len + 1)) &&
     (*(long *)((long)&psVar1->value + lVar4 * 8 + 0x10) == 1)) {
    *(undefined8 *)((long)&psVar1->value + lVar4 * 8 + 0x10) = 0xffffffffffffffff;
  }
  if (lVar3 < 0) {
    (psVar1->value).flonum_bits[0] = -1;
  }
  (ctx->value).context.saves = local_40.next;
  return psVar1;
}

Assistant:

static sexp sexp_fixnum_to_twos_complement (sexp ctx, sexp x, int len) {
  int i;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_bignum(ctx, len);
  if (sexp_unbox_fixnum(x) < 0)
    for (i = len-1; i > 0; i--)
      sexp_bignum_data(res)[i] = (sexp_uint_t)((sexp_sint_t)-1);
  sexp_bignum_data(res)[0] = ~(-(sexp_unbox_fixnum(x)));
  res = sexp_bignum_fxadd(ctx, res, 1);
  if (sexp_bignum_length(res) == len + 1 && sexp_bignum_data(res)[len] == 1)
    sexp_bignum_data(res)[len] = -1;
  if (sexp_unbox_fixnum(x) < 0)
    sexp_bignum_sign(res) = -1;
  sexp_gc_release1(ctx);
  return res;
}